

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> * __thiscall
asl::Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::operator=
          (Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this,
          Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *b)

{
  Dic<asl::String> *pDVar1;
  KeyVal *pKVar2;
  
  if (this->_a != b->_a) {
    LOCK();
    pDVar1 = &this->_a[-1].value;
    *(int *)&(pDVar1->super_Map<asl::String,_asl::String>).a._a =
         *(int *)&(pDVar1->super_Map<asl::String,_asl::String>).a._a + -1;
    UNLOCK();
    if (*(int *)&(pDVar1->super_Map<asl::String,_asl::String>).a._a == 0) {
      free(this,b);
    }
    pKVar2 = b->_a;
    this->_a = pKVar2;
    LOCK();
    pDVar1 = &pKVar2[-1].value;
    *(int *)&(pDVar1->super_Map<asl::String,_asl::String>).a._a =
         *(int *)&(pDVar1->super_Map<asl::String,_asl::String>).a._a + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

Array& operator=(const Array& b)
	{
		if (_a == b._a)
			return *this;
		if(--d().rc==0) free();
		_a = b._a;
		++d().rc;
		return *this;
	}